

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  int iVar5;
  TValue *pTVar6;
  GCObject *pGVar7;
  ushort uVar8;
  GCObject *pGVar9;
  uint uVar10;
  char *pcVar11;
  Table *pTVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  lua_Integer i1;
  lua_Integer i2;
  
  uVar2 = t1->tt_;
  uVar3 = t2->tt_;
  uVar8 = uVar2 & 0x7f;
  pTVar6 = t2;
  if (uVar8 != (uVar3 & 0x7f)) {
    if ((uVar3 & 0xf) != 3 || (uVar2 & 0xf) != 3) {
      return 0;
    }
    if (uVar2 == 0x13) {
      i1 = (t1->value_).i;
    }
    else {
      iVar5 = luaV_tointegerns(t1,&i1,F2Ieq);
      if (iVar5 == 0) {
        return 0;
      }
    }
    if (uVar3 != 0x13) {
      pTVar6 = (TValue *)&i2;
      iVar5 = luaV_tointegerns(t2,(lua_Integer *)pTVar6,F2Ieq);
      if (iVar5 == 0) {
        return 0;
      }
    }
    goto LAB_001275e0;
  }
  uVar10 = 1;
  switch(uVar8) {
  case 0:
    goto switchD_0012731e_caseD_0;
  case 1:
    if (uVar2 != 1) {
      pcVar11 = "((((t1))->tt_) == (1))";
LAB_001277b1:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2eb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 1) {
      pcVar11 = "((((t2))->tt_) == (1))";
      goto LAB_001277b1;
    }
    bVar13 = (t1->value_).b == (t2->value_).b;
    goto LAB_001275e5;
  case 2:
    if (uVar2 != 2) {
      pcVar11 = "((((t1))->tt_) == (2))";
LAB_00127731:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ec,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 2) {
      pcVar11 = "((((t2))->tt_) == (2))";
      goto LAB_00127731;
    }
    break;
  case 3:
    if (uVar2 == 3) {
      if (uVar3 == 3) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (t1->value_).i;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (t2->value_).i;
        uVar4 = vcmpsd_avx512f(auVar14,auVar1,0);
        return (uint)uVar4 & 1;
      }
      pcVar11 = "((((t2))->tt_) == (((3) | ((0) << 4))))";
    }
    else {
      pcVar11 = "((((t1))->tt_) == (((3) | ((0) << 4))))";
    }
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2ea,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 4:
    if ((uVar2 & 0xf) != 4) {
      pcVar11 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
LAB_001278ad:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (t1->value_).gc;
    if ((pGVar7->tt & 0xf) != 4) {
      pcVar11 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_001278ad;
    }
    if (pGVar7->tt != 4) {
      pcVar11 = 
      "((((void) sizeof (((((((((t1))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((t1))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((t1))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((t1)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((t1)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((t1)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((t1)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_001278ad;
    }
    if ((uVar3 & 0xf) != 4) {
      pcVar11 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
      goto LAB_001278ad;
    }
    pGVar9 = (t2->value_).gc;
    if ((pGVar9->tt & 0xf) != 4) {
      pcVar11 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_001278ad;
    }
    goto LAB_00127580;
  case 5:
    if (uVar2 != 0x8005) {
      pcVar11 = "((((t1))->tt_) == (((5) | (1 << 15))))";
LAB_0012788e:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (GCObject *)(t1->value_).f;
    if (pGVar7->tt != '\x05') {
      pcVar11 = "(((t1)->value_).gc)->tt == 5";
      goto LAB_0012788e;
    }
    if (uVar3 != 0x8005) {
      pcVar11 = "((((t2))->tt_) == (((5) | (1 << 15))))";
      goto LAB_0012788e;
    }
    if (((t2->value_).gc)->tt != '\x05') {
      pcVar11 = "(((t2)->value_).gc)->tt == 5";
      goto LAB_0012788e;
    }
    if (pGVar7 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar12 = *(Table **)&pGVar7[2].tt;
    if ((pTVar12 != (Table *)0x0) && ((pTVar12->flags & 0x20) == 0)) {
      pTVar6 = luaT_gettm(pTVar12,TM_EQ,L->l_G->tmname[5]);
      if (pTVar6 != (TValue *)0x0) goto LAB_0012769b;
      if (t2->tt_ != 0x8005) {
        pcVar11 = "((((t2))->tt_) == (((5) | (1 << 15))))";
        goto LAB_0012791c;
      }
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
      pcVar11 = "(((t2)->value_).gc)->tt == 5";
LAB_0012791c:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pTVar12 = *(Table **)((t2->value_).f + 0x28);
    goto LAB_00127678;
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
switchD_0012731e_caseD_6:
    if (-1 < (short)uVar2) {
      pcVar11 = "(((t1)->tt_) & (1 << 15))";
LAB_001276ee:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x307,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (-1 < (short)uVar3) {
      pcVar11 = "(((t2)->tt_) & (1 << 15))";
      goto LAB_001276ee;
    }
    break;
  case 7:
    if (uVar2 != 0x8007) {
      pcVar11 = "((((t1))->tt_) == (((7) | (1 << 15))))";
LAB_00127866:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (GCObject *)(t1->value_).f;
    if (pGVar7->tt != '\a') {
      pcVar11 = "(((t1)->value_).gc)->tt == 7";
      goto LAB_00127866;
    }
    if (uVar3 != 0x8007) {
      pcVar11 = "((((t2))->tt_) == (((7) | (1 << 15))))";
      goto LAB_00127866;
    }
    if (((t2->value_).gc)->tt != '\a') {
      pcVar11 = "(((t2)->value_).gc)->tt == 7";
      goto LAB_00127866;
    }
    if (pGVar7 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar12 = (Table *)pGVar7[1].next;
    if ((pTVar12 != (Table *)0x0) && ((pTVar12->flags & 0x20) == 0)) {
      pTVar6 = luaT_gettm(pTVar12,TM_EQ,L->l_G->tmname[5]);
      if (pTVar6 != (TValue *)0x0) goto LAB_0012769b;
      if (t2->tt_ != 0x8007) {
        pcVar11 = "((((t2))->tt_) == (((7) | (1 << 15))))";
        goto LAB_001278fd;
      }
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
      pcVar11 = "(((t2)->value_).gc)->tt == 7";
LAB_001278fd:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pTVar12 = *(Table **)((t2->value_).f + 0x10);
LAB_00127678:
    if (pTVar12 == (Table *)0x0) {
      return 0;
    }
    if ((pTVar12->flags & 0x20) != 0) {
      return 0;
    }
    pTVar6 = luaT_gettm(pTVar12,TM_EQ,L->l_G->tmname[5]);
    if (pTVar6 == (TValue *)0x0) {
      return 0;
    }
LAB_0012769b:
    luaT_callTM(L,pTVar6,t1,t2,L->top,1);
    uVar2 = L->top->tt_;
    if (uVar2 == 0) {
      return (uint)uVar2;
    }
    if (uVar2 == 1) {
      return (uint)((L->top->value_).b != 0);
    }
    return 1;
  case 0x13:
    if (uVar2 != 0x13) {
      pcVar11 = "((((t1))->tt_) == (((3) | ((1) << 4))))";
LAB_001277fb:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2e9,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 0x13) {
      pcVar11 = "((((t2))->tt_) == (((3) | ((1) << 4))))";
      goto LAB_001277fb;
    }
    break;
  case 0x14:
    if ((uVar2 & 0xf) == 4) {
      if ((((TString *)(t1->value_).gc)->tt & 0xf) == 4) {
        if ((uVar3 & 0xf) == 4) {
          if ((((TString *)(t2->value_).gc)->tt & 0xf) == 4) {
            iVar5 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
            return iVar5;
          }
          pcVar11 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
        }
        else {
          pcVar11 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
        }
      }
      else {
        pcVar11 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      }
    }
    else {
      pcVar11 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 0x15:
switchD_0012731e_caseD_15:
    if ((uVar2 != 0x8015) && (uVar2 != 0x8025)) {
      pcVar11 = 
      "(((((t1))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t1))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_001278de:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (t1->value_).gc;
    if ((pGVar7->tt != '\x15') && (pGVar7->tt != '%')) {
      pcVar11 = 
      "((((t1)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t1)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_001278de;
    }
    if ((uVar3 != 0x8015) && (uVar3 != 0x8025)) {
      pcVar11 = 
      "(((((t2))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t2))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
      goto LAB_001278de;
    }
    pGVar9 = (t2->value_).gc;
    if ((pGVar9->tt != '\x15') && (pGVar9->tt != '%')) {
      pcVar11 = 
      "((((t2)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t2)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_001278de;
    }
LAB_00127580:
    bVar13 = pGVar7 == pGVar9;
    goto LAB_001275e5;
  case 0x16:
    if (uVar2 != 0x16) {
      pcVar11 = "((((t1))->tt_) == (((6) | ((1) << 4))))";
LAB_00127765:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ed,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 0x16) {
      pcVar11 = "((((t2))->tt_) == (((6) | ((1) << 4))))";
      goto LAB_00127765;
    }
    break;
  default:
    if (uVar8 == 0x25) goto switchD_0012731e_caseD_15;
    if (uVar8 != 0x46) goto switchD_0012731e_caseD_6;
  }
  i1 = (lua_Integer)(t1->value_).gc;
LAB_001275e0:
  bVar13 = (GCObject *)i1 == (pTVar6->value_).gc;
LAB_001275e5:
  uVar10 = (uint)bVar13;
switchD_0012731e_caseD_0:
  return uVar10;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
    if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointegerns(t1, &i1) && tointegerns(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttype(t1)) {
    case LUA_TNIL: return 1;
    case LUA_TNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_TNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_TBOOLEAN: return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
    case LUA_TLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_TLCF: return fvalue(t1) == fvalue(t2);
	case RAVI_TFCF: return fcfvalue(t1) == fcfvalue(t2);
    case LUA_TSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_TLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_TUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      if (arrvalue(t1) == arrvalue(t2)) return 1;
      else return 0;
    }
    case LUA_TTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
  return !l_isfalse(L->top);
}